

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer.cpp
# Opt level: O0

uchar __thiscall bidfx_public_api::tools::ByteBuffer::ReadByte(ByteBuffer *this)

{
  uchar uVar1;
  ostream *this_00;
  out_of_range *this_01;
  string local_1c8 [48];
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [376];
  ByteBuffer *local_10;
  ByteBuffer *this_local;
  
  local_10 = this;
  if (this->reader_index_ == this->writer_index_) {
    std::__cxx11::stringstream::stringstream(local_198);
    this_00 = std::operator<<(local_188,"Readable byte limit exceeded: ");
    std::ostream::operator<<(this_00,this->reader_index_);
    this_01 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::out_of_range::out_of_range(this_01,local_1c8);
    __cxa_throw(this_01,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  uVar1 = GetNextByte(this);
  return uVar1;
}

Assistant:

unsigned char ByteBuffer::ReadByte()
{
    if (reader_index_ == writer_index_)
    {
        std::stringstream ss;
        ss << "Readable byte limit exceeded: " << reader_index_;
        throw std::out_of_range(ss.str());
    }
    return GetNextByte();
}